

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution_x86_fma::create_pipeline(Deconvolution_x86_fma *this,Option *opt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  _func_int *p_Var6;
  long lVar7;
  int _w;
  ulong uVar8;
  undefined4 *puVar9;
  int k;
  int _h;
  ulong uVar10;
  undefined4 *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  undefined4 *puVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int i;
  long lVar22;
  Mat local_c0;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  undefined1 auStack_48 [12];
  size_t local_38;
  
  p_Var6 = this->_vptr_Deconvolution_x86_fma[-3];
  uVar8 = (long)*(int *)(&this->field_0xd8 + (long)p_Var6) *
          (long)*(int *)(&this->field_0xd4 + (long)p_Var6);
  _w = (int)uVar8;
  uVar17 = (long)*(int *)(&this->field_0x110 + (long)p_Var6) / (long)_w;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
           (long)*(int *)(&this->field_0xd0 + (long)p_Var6);
  local_38 = 0;
  local_78._0_8_ = (Allocator *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  iVar20 = 0;
  local_58 = (Allocator *)local_78._0_8_;
  iStack_50 = local_78._8_4_;
  iStack_4c = local_78._12_4_;
  auStack_48 = local_78._16_12_;
  Mat::create((Mat *)local_78,*(int *)(&this->field_0x18c + (long)p_Var6),4,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86_fma;
  p_Var6 = pp_Var1[-3];
  uVar12 = *(uint *)(&this->field_0xd0 + (long)p_Var6);
  _h = (int)uVar17;
  if (0 < (int)(uVar12 * _h)) {
    lVar7 = *(long *)(&this->field_0x160 + (long)p_Var6);
    puVar11 = (undefined4 *)(local_78._0_8_ + uVar8 * 4 + -4);
    do {
      if (0 < _w) {
        uVar13 = 0;
        puVar18 = puVar11;
        do {
          *puVar18 = *(undefined4 *)(lVar7 + uVar13 * 4);
          uVar13 = uVar13 + 1;
          puVar18 = puVar18 + -1;
        } while ((uVar8 & 0xffffffff) != uVar13);
        p_Var6 = pp_Var1[-3];
      }
      iVar20 = iVar20 + 1;
      uVar12 = *(uint *)(&this->field_0xd0 + (long)p_Var6);
      lVar7 = lVar7 + uVar8 * 4;
      puVar11 = puVar11 + uVar8;
    } while (iVar20 < (int)(uVar12 * _h));
  }
  lVar7 = 1;
  uVar13 = 1;
  if (opt->use_packing_layout != false) {
    lVar7 = (ulong)((uVar17 & 3) == 0) * 3 + 1;
    if ((uVar17 & 7) == 0) {
      lVar7 = 8;
    }
    uVar13 = (ulong)((uVar12 & 3) == 0) * 3 + 1;
    if ((uVar12 & 7) == 0) {
      uVar13 = 8;
    }
  }
  Mat::reshape(&local_c0,(Mat *)local_78,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var6),
               (Allocator *)0x0);
  iVar21 = (int)lVar7;
  iVar20 = (int)uVar13;
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar21),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_fma[-3]) / iVar20,
              (ulong)(uint)(iVar20 * iVar21 * 4),iVar20 * iVar21,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86_fma;
  p_Var6 = pp_Var1[-3];
  if (iVar20 <= *(int *)(&this->field_0xd0 + (long)p_Var6)) {
    pvVar2 = (this->weight_data_tm).data;
    sVar3 = (this->weight_data_tm).cstep;
    sVar4 = (this->weight_data_tm).elemsize;
    uVar17 = 0;
    do {
      if (iVar21 <= _h) {
        puVar11 = (undefined4 *)
                  ((long)(int)((uVar17 & 0xffffffff) / uVar13) * sVar3 * sVar4 + (long)pvVar2);
        puVar18 = (undefined4 *)(local_c0.cstep * local_c0.elemsize * uVar17 + (long)local_c0.data);
        lVar19 = 0;
        do {
          if (0 < _w) {
            uVar10 = 0;
            puVar9 = puVar18;
            do {
              lVar22 = 0;
              uVar14 = uVar13;
              puVar16 = puVar9;
              puVar15 = puVar9;
              do {
                do {
                  *puVar11 = *puVar16;
                  puVar11 = puVar11 + 1;
                  uVar14 = uVar14 - 1;
                  puVar16 = (undefined4 *)((long)puVar16 + local_c0.cstep * local_c0.elemsize);
                } while (uVar14 != 0);
                lVar22 = lVar22 + 1;
                puVar16 = (undefined4 *)((long)puVar15 + (long)local_c0.w * local_c0.elemsize);
                uVar14 = uVar13;
                puVar15 = puVar16;
              } while (lVar22 != lVar7);
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + 1;
            } while (uVar10 != (uVar8 & 0xffffffff));
          }
          lVar19 = lVar19 + lVar7;
          puVar18 = (undefined4 *)((long)puVar18 + (long)local_c0.w * local_c0.elemsize * lVar7);
        } while (lVar19 < (long)((long)_h - (ulong)(iVar21 - 1)));
        p_Var6 = pp_Var1[-3];
      }
      uVar17 = uVar17 + uVar13;
    } while ((long)(uVar17 + (iVar20 - 1)) < (long)*(int *)(&this->field_0xd0 + (long)p_Var6));
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        if (local_c0.data != (void *)0x0) {
          free(local_c0.data);
        }
      }
      else {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var6 = this->_vptr_Deconvolution_x86_fma[-3];
    piVar5 = *(int **)(&this->field_0x168 + (long)p_Var6);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var6) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var6) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var6));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var6) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var6) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var6) = 0;
  }
  piVar5 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if ((Allocator *)local_78._0_8_ != (Allocator *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86_fma::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}